

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void embree::printCommandLine(int argc,char **argv)

{
  ostream *poVar1;
  long in_RSI;
  char *pcVar2;
  int in_EDI;
  int i;
  int local_14;
  
  for (local_14 = 0; local_14 < in_EDI; local_14 = local_14 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,*(char **)(in_RSI + (long)local_14 * 8));
    pcVar2 = "";
    if (local_14 < in_EDI + -1) {
      pcVar2 = " ";
    }
    std::operator<<(poVar1,pcVar2);
  }
  if (0 < in_EDI) {
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void printCommandLine(int argc, char** argv)
{
  for (int i = 0; i < argc; ++i)
      std::cout << argv[i] << (i < argc-1 ? " " : "");
  if (argc > 0) std::cout <<  std::endl;
}